

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  lys_node_list *node;
  lys_node_list *list;
  uint8_t *puVar4;
  char *__src;
  lys_module *plVar5;
  lys_module *plVar6;
  lys_node *plVar7;
  LY_ERR *pLVar8;
  char *pcVar9;
  lys_module *module;
  undefined8 uVar10;
  LY_ECODE code;
  char *pcVar11;
  size_t __n;
  lys_module *local_88;
  char *local_78;
  char *name;
  lys_node_list *local_68;
  char *local_60;
  int local_54;
  int local_50;
  int is_relative;
  int has_predicate;
  char *mod_name;
  uint local_38;
  int nam_len;
  int r;
  int mod_name_len;
  
  name = ly_buf();
  local_54 = -1;
  if ((nodeid == (char *)0x0) || (ctx == (ly_ctx *)0x0 && start == (lys_node *)0x0)) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x7d4,
                  "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = start->module->ctx;
  }
  uVar2 = parse_schema_nodeid(nodeid,(char **)&has_predicate,&nam_len,&local_78,
                              (int *)((long)&mod_name + 4),&local_54,&local_50);
  local_38 = uVar2;
  if (0 < (int)uVar2) {
    if (local_54 == 0) {
      if (_has_predicate == (char *)0x0) {
        ly_vlog(LYE_PATH_MISSMOD,LY_VLOG_STR,nodeid);
        return (lys_node *)0x0;
      }
      if (0x3ff < nam_len) {
        pLVar8 = ly_errno_location();
        *pLVar8 = LY_EINT;
        uVar10 = 0x7ef;
LAB_0011550c:
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
               ,uVar10);
        return (lys_node *)0x0;
      }
      puVar4 = ly_buf_used_location();
      pcVar11 = name;
      if (*puVar4 == '\0') {
        pcVar9 = (char *)0x0;
        local_60 = nodeid;
      }
      else if (*name == '\0') {
        pcVar9 = (char *)0x0;
        local_60 = nodeid;
      }
      else {
        local_60 = nodeid;
        pcVar9 = strndup(name,0x3ff);
      }
      puVar4 = ly_buf_used_location();
      *puVar4 = *puVar4 + '\x01';
      memmove(pcVar11,_has_predicate,(long)nam_len);
      pcVar11[nam_len] = '\0';
      module = ly_ctx_get_module(ctx,pcVar11,(char *)0x0);
      if (pcVar9 != (char *)0x0) {
        strcpy(pcVar11,pcVar9);
        free(pcVar9);
      }
      puVar4 = ly_buf_used_location();
      *puVar4 = *puVar4 + 0xff;
      if (module == (lys_module *)0x0) {
LAB_001155d6:
        pcVar11 = strndup(local_60,(size_t)(_has_predicate + ((long)nam_len - (long)local_60)));
        code = LYE_PATH_INMOD;
LAB_001155f5:
        ly_vlog(code,LY_VLOG_STR,pcVar11);
LAB_00115604:
        free(pcVar11);
        return (lys_node *)0x0;
      }
      _has_predicate = (char *)0x0;
      nam_len = 0;
      node = (lys_node_list *)0x0;
    }
    else {
      node = (lys_node_list *)start;
      local_60 = nodeid;
      if (start == (lys_node *)0x0) {
        __assert_fail("start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                      ,0x7e2,
                      "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                     );
      }
      do {
        if (node->nodetype != LYS_USES) break;
        node = (lys_node_list *)lys_parent((lys_node *)node);
      } while (node != (lys_node_list *)0x0);
      module = start->module;
    }
    pcVar11 = local_60 + uVar2;
    is_relative = 0;
    local_88 = module;
    do {
      list = (lys_node_list *)lys_getnext((lys_node *)0x0,(lys_node *)node,module,0xb);
      while (list != (lys_node_list *)0x0) {
        pcVar9 = list->name;
        local_68 = node;
        if (pcVar9 != (char *)0x0) {
          __n = (size_t)mod_name._4_4_;
          iVar3 = strncmp(local_78,pcVar9,__n);
          if ((iVar3 == 0) && (pcVar9[__n] == '\0')) {
            plVar5 = local_88;
            if (_has_predicate != (char *)0x0) {
              if (0x3ff < nam_len) {
                pLVar8 = ly_errno_location();
                *pLVar8 = LY_EINT;
                uVar10 = 0x81c;
                goto LAB_0011550c;
              }
              puVar4 = ly_buf_used_location();
              pcVar9 = name;
              if (*puVar4 == '\0') {
                __src = (char *)0x0;
              }
              else if (*name == '\0') {
                __src = (char *)0x0;
              }
              else {
                __src = strndup(name,0x3ff);
              }
              puVar4 = ly_buf_used_location();
              *puVar4 = *puVar4 + '\x01';
              memmove(pcVar9,_has_predicate,(long)nam_len);
              pcVar9[nam_len] = '\0';
              plVar5 = ly_ctx_get_module(ctx,pcVar9,(char *)0x0);
              if (__src != (char *)0x0) {
                strncpy(pcVar9,__src,0x3ff);
                free(__src);
              }
              puVar4 = ly_buf_used_location();
              *puVar4 = *puVar4 + 0xff;
              if (plVar5 == (lys_module *)0x0) goto LAB_001155d6;
            }
            plVar6 = lys_node_module((lys_node *)list);
            if (plVar5 == plVar6) {
              if (local_50 != 0) {
                local_38 = 0;
                if ((list->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                  if (list->nodetype != LYS_LIST) {
                    uVar2 = (uint)*pcVar11;
                    goto LAB_001154dd;
                  }
                  iVar3 = resolve_json_schema_list_predicate(pcVar11,list,(int *)&local_38);
                  if (iVar3 != 0) {
                    return (lys_node *)0x0;
                  }
                }
                else {
                  local_38 = parse_schema_json_predicate
                                       (pcVar11,(char **)0x0,(int *)0x0,(char **)0x0,(int *)0x0,
                                        &local_50);
                  pcVar9 = pcVar11;
                  if ((int)local_38 < 1) goto LAB_001154c6;
                }
                pcVar11 = pcVar11 + (int)local_38;
              }
              plVar7 = lys_parent((lys_node *)list);
              if ((plVar7 != (lys_node *)0x0) &&
                 (plVar7 = lys_parent((lys_node *)list), plVar7->nodetype == LYS_CHOICE)) {
                is_relative = is_relative ^ -(uint)(list->nodetype != LYS_CASE);
              }
              uVar2 = (uint)*pcVar11;
              if (uVar2 == 0) {
                if (is_relative == 0) {
                  return (lys_node *)list;
                }
                pcVar11 = strndup(local_60,(size_t)(local_78 +
                                                   ((long)mod_name._4_4_ - (long)local_60)));
                ly_vlog(LYE_PATH_INNODE,LY_VLOG_STR,pcVar11);
                ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                        "Schema shorthand case path must include the virtual case statement.");
                goto LAB_00115604;
              }
              node = local_68;
              if ((is_relative == 0) &&
                 (node = list, (list->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN
                 )) goto LAB_001154dd;
              local_88 = module;
              if (node != (lys_node_list *)0x0) {
                local_88 = node->child->module;
              }
              break;
            }
          }
        }
        list = (lys_node_list *)lys_getnext((lys_node *)list,(lys_node *)local_68,module,0xb);
        node = local_68;
      }
      if (list == (lys_node_list *)0x0) {
        pcVar11 = strndup(local_60,(size_t)(local_78 + ((long)mod_name._4_4_ - (long)local_60)));
        code = LYE_PATH_INNODE;
        goto LAB_001155f5;
      }
      local_38 = parse_schema_nodeid(pcVar11,(char **)&has_predicate,&nam_len,&local_78,
                                     (int *)((long)&mod_name + 4),&local_54,&local_50);
      pcVar9 = pcVar11;
      if ((int)local_38 < 1) goto LAB_001154c6;
      pcVar11 = pcVar11 + local_38;
    } while( true );
  }
  pcVar11 = nodeid + -uVar2;
  cVar1 = nodeid[-uVar2];
LAB_001154d1:
  uVar2 = (uint)cVar1;
LAB_001154dd:
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar2,pcVar11);
  return (lys_node *)0x0;
LAB_001154c6:
  pcVar11 = pcVar9 + -local_38;
  cVar1 = pcVar9[-local_38];
  goto LAB_001154d1;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, struct ly_ctx *ctx, const struct lys_node *start)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate, shorthand = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        } else if (mod_name_len > LY_BUF_SIZE - 1) {
            LOGINT;
            return NULL;
        }

        if (ly_buf_used && module_name[0]) {
            buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
        }
        ly_buf_used++;

        memmove(module_name, mod_name, mod_name_len);
        module_name[mod_name_len] = '\0';
        module = ly_ctx_get_module(ctx, module_name, NULL);

        if (buf_backup) {
            /* return previous internal buffer content */
            strcpy(module_name, buf_backup);
            free(buf_backup);
            buf_backup = NULL;
        }
        ly_buf_used--;

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* check for shorthand cases - then 'start_parent' does not change */
                if (lys_parent(sibling) && (lys_parent(sibling)->nodetype == LYS_CHOICE) && (sibling->nodetype != LYS_CASE)) {
                    shorthand = ~shorthand;
                }

                /* the result node? */
                if (!id[0]) {
                    if (shorthand) {
                        /* wrong path for shorthand */
                        str = strndup(nodeid, (name + nam_len) - nodeid);
                        LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
                        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Schema shorthand case path must include the virtual case statement.");
                        free(str);
                        return NULL;
                    }
                    return sibling;
                }

                if (!shorthand) {
                    /* move down the tree, if possible */
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    start_parent = sibling;
                }

                /* update prev mod */
                prev_mod = (start_parent ? start_parent->child->module : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT;
    return NULL;
}